

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O2

void __thiscall
OpenMPDeviceTypeClause::generateDOT
          (OpenMPDeviceTypeClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  string sStack_1a8;
  string node_id;
  string local_168;
  string parameter_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string indent;
  string clause_kind;
  string current_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)depth);
  std::__cxx11::to_string(&local_168,depth);
  std::operator+(&node_id,"device_type_",&local_168);
  std::operator+(&parameter_string,&node_id,"_");
  std::__cxx11::to_string(&sStack_1a8,index);
  std::operator+(&clause_kind,&parameter_string,&sStack_1a8);
  std::__cxx11::string::~string((string *)&sStack_1a8);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&local_168);
  std::operator+(&sStack_1a8,&indent,parent_node);
  std::operator+(&local_168,&sStack_1a8,"-- ");
  std::operator+(&node_id,&local_168,&clause_kind);
  std::operator+(&parameter_string,&node_id,"\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&parameter_string);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&node_id);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&sStack_1a8);
  std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&indent);
  parameter_string._M_dataplus._M_p = (pointer)&parameter_string.field_2;
  parameter_string._M_string_length = 0;
  parameter_string.field_2._M_local_buf[0] = '\0';
  if (this->device_type_kind < OMPC_DEVICE_TYPE_unknown) {
    std::__cxx11::string::assign((char *)&parameter_string);
    if (parameter_string._M_string_length != 0) {
      std::operator+(&node_id,&clause_kind,"_kind");
      std::operator+(&local_128,&indent,&clause_kind);
      std::operator+(&local_108,&local_128," -- ");
      std::operator+(&sStack_1a8,&local_108,&node_id);
      std::operator+(&local_168,&sStack_1a8,"\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&sStack_1a8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::operator+(&local_88,&indent,"\t");
      std::operator+(&local_68,&local_88,&node_id);
      std::operator+(&local_48,&local_68," [label = \"");
      std::operator+(&local_128,&local_48,&node_id);
      std::operator+(&local_108,&local_128,"\\n ");
      std::operator+(&sStack_1a8,&local_108,&parameter_string);
      std::operator+(&local_168,&sStack_1a8,"\"]\n");
      std::__cxx11::string::operator=((string *)&current_line,(string *)&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&sStack_1a8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&node_id);
    }
  }
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&clause_kind);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&current_line);
  return;
}

Assistant:

void OpenMPDeviceTypeClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "device_type_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPDeviceTypeClauseKind device_type_kind = this->getDeviceTypeClauseKind();
    std::string parameter_string;
    switch (device_type_kind) {
        case OMPC_DEVICE_TYPE_host:
            parameter_string = "host";
            break;
        case OMPC_DEVICE_TYPE_nohost:
            parameter_string = "nohost";
            break;
        case OMPC_DEVICE_TYPE_any:
            parameter_string = "any";
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_kind";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
}